

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log_msg_buffer-inl.h
# Opt level: O0

log_msg_buffer * __thiscall
spdlog::details::log_msg_buffer::operator=(log_msg_buffer *this,log_msg_buffer *other)

{
  char *begin;
  char *pcVar1;
  size_t sVar2;
  void *in_RSI;
  log_msg_buffer *in_RDI;
  log_msg_buffer *unaff_retaddr;
  
  memcpy(in_RDI,in_RSI,0x60);
  ::fmt::v8::detail::buffer<char>::clear(&(in_RDI->buffer).super_buffer<char>);
  begin = ::fmt::v8::detail::buffer<char>::data((buffer<char> *)((long)in_RSI + 0x60));
  pcVar1 = ::fmt::v8::detail::buffer<char>::data((buffer<char> *)((long)in_RSI + 0x60));
  sVar2 = ::fmt::v8::detail::buffer<char>::size((buffer<char> *)((long)in_RSI + 0x60));
  ::fmt::v8::detail::buffer<char>::append<char>
            (&(in_RDI->buffer).super_buffer<char>,begin,pcVar1 + sVar2);
  update_string_views(unaff_retaddr);
  return in_RDI;
}

Assistant:

SPDLOG_INLINE log_msg_buffer &log_msg_buffer::operator=(const log_msg_buffer &other)
{
    log_msg::operator=(other);
    buffer.clear();
    buffer.append(other.buffer.data(), other.buffer.data() + other.buffer.size());
    update_string_views();
    return *this;
}